

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5ApiQueryPhrase(Fts5Context *pCtx,int iPhrase,void *pUserData,
                      _func_int_Fts5ExtensionApi_ptr_Fts5Context_ptr_void_ptr *xCallback)

{
  int *__src;
  char *__s;
  Fts5Cursor *pCursor;
  void *pvVar1;
  _func_int_Fts5ExtensionApi_ptr_Fts5Context_ptr_void_ptr *p_Var2;
  int iVar3;
  int iVar4;
  Fts5Expr *p;
  Fts5ExprPhrase **ppFVar5;
  Fts5ExprNode *pFVar6;
  Fts5ExprNearset *pFVar7;
  Fts5Colset *__dest;
  size_t sVar8;
  code *pcVar9;
  int in_R8D;
  int in_R9D;
  long lVar10;
  long *plVar11;
  bool bVar12;
  Fts5Cursor *pNew;
  int local_9c;
  Fts5Cursor *local_98;
  Fts5Cursor *local_90;
  Fts5ExprPhrase *local_88;
  undefined8 uStack_80;
  Fts5FullTable *local_70;
  long *local_68;
  Fts5Expr *local_60;
  undefined8 *local_58;
  void *local_50;
  _func_int_Fts5ExtensionApi_ptr_Fts5Context_ptr_void_ptr *local_48;
  long *local_40;
  long *local_38;
  
  local_70 = *(Fts5FullTable **)pCtx;
  local_90 = (Fts5Cursor *)0x0;
  local_50 = pUserData;
  local_48 = xCallback;
  iVar3 = fts5OpenMethod((sqlite3_vtab *)local_70,(sqlite3_vtab_cursor **)&local_90);
  if (iVar3 == 0) {
    local_90->ePlan = 1;
    local_90->iFirstRowid = -0x8000000000000000;
    local_90->iLastRowid = 0x7fffffffffffffff;
    local_98 = local_90;
    (local_90->base).pVtab = (sqlite3_vtab *)local_70;
    local_58 = *(undefined8 **)(pCtx + 0x40);
    local_9c = 0;
    local_88 = (Fts5ExprPhrase *)0x0;
    uStack_80 = 0;
    plVar11 = *(long **)(local_58[4] + (long)iPhrase * 8);
    p = (Fts5Expr *)sqlite3Fts5MallocZero(&local_9c,0x28);
    if (local_9c == 0) {
      ppFVar5 = (Fts5ExprPhrase **)sqlite3Fts5MallocZero(&local_9c,8);
      p->apExprPhrase = ppFVar5;
    }
    if (local_9c == 0) {
      pFVar6 = (Fts5ExprNode *)sqlite3Fts5MallocZero(&local_9c,0x38);
      p->pRoot = pFVar6;
    }
    if (local_9c == 0) {
      pFVar7 = (Fts5ExprNearset *)sqlite3Fts5MallocZero(&local_9c,0x28);
      p->pRoot->pNear = pFVar7;
    }
    if ((local_9c == 0) && (__src = *(int **)(*(long *)(*plVar11 + 0x20) + 8), __src != (int *)0x0))
    {
      sVar8 = (long)*__src * 4 + 4;
      __dest = (Fts5Colset *)sqlite3Fts5MallocZero(&local_9c,sVar8);
      if (__dest != (Fts5Colset *)0x0) {
        memcpy(__dest,__src,sVar8);
      }
      p->pRoot->pNear->pColset = __dest;
    }
    if ((int)plVar11[3] == 0) {
      local_88 = (Fts5ExprPhrase *)sqlite3Fts5MallocZero(&local_9c,0x40);
      iVar3 = local_9c;
    }
    else {
      iVar3 = local_9c;
      local_60 = p;
      if (local_9c == 0) {
        local_40 = plVar11 + 4;
        lVar10 = 0;
        local_38 = plVar11;
        do {
          p = local_60;
          plVar11 = local_38;
          if ((int)local_38[3] <= lVar10) break;
          plVar11 = local_40 + lVar10 * 4;
          bVar12 = iVar3 == 0;
          local_68 = plVar11;
          if (bVar12) {
            iVar4 = 0;
            do {
              __s = (char *)plVar11[1];
              sVar8 = strlen(__s);
              iVar3 = fts5ParseTokenize(&local_88,iVar4,__s,(int)sVar8,in_R8D,in_R9D);
              plVar11 = (long *)plVar11[3];
              bVar12 = iVar3 == 0;
              if (plVar11 == (long *)0x0) break;
              iVar4 = 1;
            } while (iVar3 == 0);
          }
          if (bVar12) {
            local_88->aTerm[lVar10].bPrefix = (u8)*local_68;
            local_88->aTerm[lVar10].bFirst = *(u8 *)((long)local_68 + 1);
          }
          lVar10 = lVar10 + 1;
          p = local_60;
          plVar11 = local_38;
        } while (iVar3 == 0);
      }
    }
    local_9c = iVar3;
    iVar3 = local_9c;
    if (local_9c == 0) {
      p->pIndex = (Fts5Index *)*local_58;
      p->pConfig = (Fts5Config *)local_58[1];
      p->nPhrase = 1;
      *p->apExprPhrase = local_88;
      p->pRoot->pNear->apPhrase[0] = local_88;
      pFVar6 = p->pRoot;
      pFVar6->pNear->nPhrase = 1;
      local_88->pNode = pFVar6;
      if ((((int)plVar11[3] == 1) && (plVar11[7] == 0)) && (*(char *)((long)plVar11 + 0x21) == '\0')
         ) {
        pFVar6->eType = 4;
        pcVar9 = fts5ExprNodeNext_TERM;
      }
      else {
        pFVar6->eType = 9;
        pcVar9 = fts5ExprNodeNext_STRING;
      }
      pFVar6->xNext = pcVar9;
    }
    else {
      sqlite3Fts5ExprFree(p);
      fts5ExprPhraseFree(local_88);
      p = (Fts5Expr *)0x0;
    }
    local_98->pExpr = p;
  }
  pCursor = local_90;
  if (iVar3 == 0) {
    iVar3 = fts5CursorFirst(local_70,local_90,0);
    p_Var2 = local_48;
    pvVar1 = local_50;
    while (iVar3 == 0) {
      if ((pCursor->csrflags & 1) != 0) {
        iVar3 = 0;
        break;
      }
      iVar4 = (*p_Var2)(&sFts5Api,(Fts5Context *)pCursor,pvVar1);
      if (iVar4 != 0) {
        iVar3 = 0;
        if (iVar4 != 0x65) {
          iVar3 = iVar4;
        }
        break;
      }
      iVar3 = fts5NextMethod(&pCursor->base);
    }
  }
  fts5CloseMethod(&local_90->base);
  return iVar3;
}

Assistant:

static int fts5ApiQueryPhrase(
  Fts5Context *pCtx, 
  int iPhrase, 
  void *pUserData,
  int(*xCallback)(const Fts5ExtensionApi*, Fts5Context*, void*)
){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  Fts5FullTable *pTab = (Fts5FullTable*)(pCsr->base.pVtab);
  int rc;
  Fts5Cursor *pNew = 0;

  rc = fts5OpenMethod(pCsr->base.pVtab, (sqlite3_vtab_cursor**)&pNew);
  if( rc==SQLITE_OK ){
    pNew->ePlan = FTS5_PLAN_MATCH;
    pNew->iFirstRowid = SMALLEST_INT64;
    pNew->iLastRowid = LARGEST_INT64;
    pNew->base.pVtab = (sqlite3_vtab*)pTab;
    rc = sqlite3Fts5ExprClonePhrase(pCsr->pExpr, iPhrase, &pNew->pExpr);
  }

  if( rc==SQLITE_OK ){
    for(rc = fts5CursorFirst(pTab, pNew, 0);
        rc==SQLITE_OK && CsrFlagTest(pNew, FTS5CSR_EOF)==0;
        rc = fts5NextMethod((sqlite3_vtab_cursor*)pNew)
    ){
      rc = xCallback(&sFts5Api, (Fts5Context*)pNew, pUserData);
      if( rc!=SQLITE_OK ){
        if( rc==SQLITE_DONE ) rc = SQLITE_OK;
        break;
      }
    }
  }

  fts5CloseMethod((sqlite3_vtab_cursor*)pNew);
  return rc;
}